

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetReader::ParquetReader
          (ParquetReader *this,ClientContext *context_p,OpenFileInfo *file_p,
          ParquetOptions *parquet_options_p,
          shared_ptr<duckdb::ParquetFileMetadataCache,_true> *metadata_p)

{
  OpenFileInfo *pOVar1;
  shared_ptr<duckdb::ExtendedOpenFileInfo,_true> *this_00;
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
  *this_01;
  shared_ptr<duckdb::EncryptionUtil,_true> *this_02;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> *__r;
  _Alloc_hider __p;
  char cVar2;
  bool bVar3;
  Allocator *pAVar4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var5;
  iterator iVar6;
  idx_t index;
  long lVar7;
  string *key;
  ParquetFileMetadataCache *pPVar8;
  type pCVar9;
  type pEVar10;
  ObjectCache *this_03;
  NotImplementedException *this_04;
  FileOpenFlags FVar11;
  shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> local_120;
  optional_idx local_110;
  undefined1 local_108 [32];
  Value metadata_cache;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0 [7];
  CachingFileSystem *local_a8;
  Allocator *local_a0;
  ParquetOptions *local_98;
  __shared_ptr<duckdb::ObjectCacheEntry,(__gnu_cxx::_Lock_policy)2> local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  string local_80;
  OpenFileInfo local_60;
  
  OpenFileInfo::OpenFileInfo(&local_60,file_p);
  BaseFileReader::BaseFileReader(&this->super_BaseFileReader,&local_60);
  OpenFileInfo::~OpenFileInfo(&local_60);
  (this->super_BaseFileReader)._vptr_BaseFileReader = (_func_int **)&PTR__ParquetReader_004dbe28;
  local_a8 = &this->fs;
  duckdb::CachingFileSystem::Get((ClientContext *)local_a8);
  pAVar4 = (Allocator *)duckdb::BufferAllocator::Get(context_p);
  this->allocator = pAVar4;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98 = &this->parquet_options;
  ParquetOptions::ParquetOptions(local_98,parquet_options_p);
  this_01 = &this->file_handle;
  (this->file_handle).
  super_unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>._M_t.
  super___uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::CachingFileHandle_*,_std::default_delete<duckdb::CachingFileHandle>_>
  .super__Head_base<0UL,_duckdb::CachingFileHandle_*,_false>._M_head_impl = (CachingFileHandle *)0x0
  ;
  (this->root_schema).
  super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
  .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl =
       (ParquetColumnSchema *)0x0;
  (this->encryption_util).internal.
  super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->encryption_util).internal.
  super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pOVar1 = &(this->super_BaseFileReader).file;
  FVar11._8_8_ = pOVar1;
  FVar11.flags = (idx_t)local_a8;
  duckdb::CachingFileSystem::OpenFile((OpenFileInfo *)&metadata_cache,FVar11);
  __p._M_p = _metadata_cache;
  _metadata_cache = (pointer)0x0;
  std::__uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>::
  reset((__uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
         *)this_01,(pointer)__p._M_p);
  std::unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>::
  ~unique_ptr((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
               *)&metadata_cache);
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
  operator->(this_01);
  cVar2 = duckdb::CachingFileHandle::CanSeek();
  if (cVar2 == '\0') {
    this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&metadata_cache,
               "Reading parquet files from a FIFO stream is not supported and cannot be efficiently supported since metadata is located at the end of the file. Write the stream to disk first and read from there instead."
               ,(allocator *)local_108);
    duckdb::NotImplementedException::NotImplementedException(this_04,(string *)&metadata_cache);
    __cxa_throw(this_04,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_110.index = 0xffffffffffffffff;
  if ((this->super_BaseFileReader).file.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_00 = &(this->super_BaseFileReader).file.extended_info;
    shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->(this_00);
    p_Var5 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->(this_00);
    std::__cxx11::string::string((string *)&metadata_cache,"encryption_key",(allocator *)local_108);
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(p_Var5,(key_type *)&metadata_cache);
    std::__cxx11::string::~string((string *)&metadata_cache);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ._M_cur != (__node_type *)0x0) {
      duckdb::StringValue::Get_abi_cxx11_
                ((Value *)((long)iVar6.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                 ._M_cur + 0x28));
      make_shared_ptr<duckdb::ParquetEncryptionConfig,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &metadata_cache);
      shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator=
                (&(this->parquet_options).encryption_config,
                 (shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)&metadata_cache);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e0);
    }
    p_Var5 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->(this_00);
    std::__cxx11::string::string((string *)&metadata_cache,"footer_size",(allocator *)local_108);
    iVar6 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(p_Var5,(key_type *)&metadata_cache);
    std::__cxx11::string::~string((string *)&metadata_cache);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ._M_cur != (__node_type *)0x0) {
      index = duckdb::UBigIntValue::Get
                        ((Value *)((long)iVar6.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                         ._M_cur + 0x28));
      optional_idx::optional_idx((optional_idx *)&metadata_cache,index);
      local_110.index = (idx_t)_metadata_cache;
    }
  }
  lVar7 = duckdb::DBConfig::GetConfig(context_p);
  this_02 = &this->encryption_util;
  if ((*(long *)(lVar7 + 0x648) == 0) || ((this->parquet_options).debug_use_openssl != true)) {
    make_shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory>();
    shared_ptr<duckdb::EncryptionUtil,_true>::
    operator=<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory,_0>
              (this_02,(shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory,_true> *)
                       &metadata_cache);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e0);
  }
  else {
    shared_ptr<duckdb::EncryptionUtil,_true>::operator=
              (this_02,(shared_ptr<duckdb::EncryptionUtil,_true> *)(lVar7 + 0x648));
  }
  __r = &this->metadata;
  if ((metadata_p->internal).
      super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator=(__r,metadata_p);
    goto LAB_002eea6a;
  }
  duckdb::Value::Value(&metadata_cache,0);
  std::__cxx11::string::string((string *)local_108,"parquet_metadata_cache",(allocator *)&local_120)
  ;
  duckdb::ClientContext::TryGetCurrentSetting((string *)context_p,(Value *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  bVar3 = duckdb::Value::GetValue<bool>();
  if (bVar3) {
    unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
    operator->(this_01);
    lVar7 = duckdb::CachingFileHandle::GetLastModifiedTime();
    key = (string *)duckdb::ObjectCache::GetObjectCache(context_p);
    ObjectCache::Get<duckdb::ParquetFileMetadataCache>((ObjectCache *)local_108,key);
    metadata_p = (shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)local_108;
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator=(__r,metadata_p);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
    if ((__r->internal).
        super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pPVar8 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(__r);
      if (lVar7 + 10 < pPVar8->read_time) goto LAB_002eea60;
    }
    local_a0 = this->allocator;
    pCVar9 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
             ::operator*(this_01);
    std::__shared_ptr<duckdb::ParquetEncryptionConfig_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::ParquetEncryptionConfig,void>
              ((__shared_ptr<duckdb::ParquetEncryptionConfig_const,(__gnu_cxx::_Lock_policy)2> *)
               &local_120,
               (__shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->parquet_options).encryption_config);
    pEVar10 = shared_ptr<duckdb::EncryptionUtil,_true>::operator*(this_02);
    LoadMetadata((duckdb *)local_108,context_p,local_a0,pCVar9,&local_120,pEVar10,local_110);
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator=
              (__r,(shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_120.internal.
                super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    this_03 = (ObjectCache *)duckdb::ObjectCache::GetObjectCache(context_p);
    std::__cxx11::string::string((string *)&local_80,(string *)pOVar1);
    std::__shared_ptr<duckdb::ObjectCacheEntry,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::ParquetFileMetadataCache,void>
              (local_90,(__shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>
                         *)__r);
    metadata_p = (shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)&local_80;
    ObjectCache::Put(this_03,(string *)metadata_p,
                     (shared_ptr<duckdb::ObjectCacheEntry,_true> *)local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    pAVar4 = this->allocator;
    pCVar9 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
             ::operator*(this_01);
    std::__shared_ptr<duckdb::ParquetEncryptionConfig_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::ParquetEncryptionConfig,void>
              ((__shared_ptr<duckdb::ParquetEncryptionConfig_const,(__gnu_cxx::_Lock_policy)2> *)
               &local_120,
               (__shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->parquet_options).encryption_config);
    pEVar10 = shared_ptr<duckdb::EncryptionUtil,_true>::operator*(this_02);
    LoadMetadata((duckdb *)local_108,context_p,pAVar4,pCVar9,&local_120,pEVar10,local_110);
    metadata_p = (shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)local_108;
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator=(__r,metadata_p);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_120.internal.
                super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
LAB_002eea60:
  duckdb::Value::~Value(&metadata_cache);
LAB_002eea6a:
  InitializeSchema(this,(ClientContext *)metadata_p);
  return;
}

Assistant:

ParquetReader::ParquetReader(ClientContext &context_p, OpenFileInfo file_p, ParquetOptions parquet_options_p,
                             shared_ptr<ParquetFileMetadataCache> metadata_p)
    : BaseFileReader(std::move(file_p)), fs(CachingFileSystem::Get(context_p)),
      allocator(BufferAllocator::Get(context_p)), parquet_options(std::move(parquet_options_p)) {
	file_handle = fs.OpenFile(file, FileFlags::FILE_FLAGS_READ);
	if (!file_handle->CanSeek()) {
		throw NotImplementedException(
		    "Reading parquet files from a FIFO stream is not supported and cannot be efficiently supported since "
		    "metadata is located at the end of the file. Write the stream to disk first and read from there instead.");
	}

	// read the extended file open info (if any)
	optional_idx footer_size;
	if (file.extended_info) {
		auto &open_options = file.extended_info->options;
		auto encryption_entry = file.extended_info->options.find("encryption_key");
		if (encryption_entry != open_options.end()) {
			parquet_options.encryption_config =
			    make_shared_ptr<ParquetEncryptionConfig>(StringValue::Get(encryption_entry->second));
		}
		auto footer_entry = file.extended_info->options.find("footer_size");
		if (footer_entry != open_options.end()) {
			footer_size = UBigIntValue::Get(footer_entry->second);
		}
	}
	// set pointer to factory method for AES state
	auto &config = DBConfig::GetConfig(context_p);
	if (config.encryption_util && parquet_options.debug_use_openssl) {
		encryption_util = config.encryption_util;
	} else {
		encryption_util = make_shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory>();
	}

	// If metadata cached is disabled
	// or if this file has cached metadata
	// or if the cached version already expired
	if (!metadata_p) {
		Value metadata_cache = false;
		context_p.TryGetCurrentSetting("parquet_metadata_cache", metadata_cache);
		if (!metadata_cache.GetValue<bool>()) {
			metadata = LoadMetadata(context_p, allocator, *file_handle, parquet_options.encryption_config,
			                        *encryption_util, footer_size);
		} else {
			auto last_modify_time = file_handle->GetLastModifiedTime();
			metadata = ObjectCache::GetObjectCache(context_p).Get<ParquetFileMetadataCache>(file.path);
			if (!metadata || (last_modify_time + 10 >= metadata->read_time)) {
				metadata = LoadMetadata(context_p, allocator, *file_handle, parquet_options.encryption_config,
				                        *encryption_util, footer_size);
				ObjectCache::GetObjectCache(context_p).Put(file.path, metadata);
			}
		}
	} else {
		metadata = std::move(metadata_p);
	}
	InitializeSchema(context_p);
}